

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

float Abc_NtkDelayTrace(Abc_Ntk_t *pNtk,Abc_Obj_t *pOut,Abc_Obj_t *pIn,int fPrint)

{
  ulong uVar1;
  float fVar2;
  long *plVar3;
  float *pfVar4;
  uint uVar5;
  int iVar6;
  int iPin;
  int iVar7;
  Vec_Int_t *vSlacks;
  Vec_Ptr_t *pVVar8;
  Vec_Ptr_t *vPath;
  void **ppvVar9;
  Vec_Int_t *vBest;
  int *piVar10;
  Abc_Time_t *pAVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  void ***pppvVar15;
  long lVar16;
  long lVar17;
  Abc_Obj_t *pAVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  int local_78;
  
  if ((pNtk->ntkFunc != ABC_FUNC_MAP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsMappedLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,0x3e6,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if ((pOut != (Abc_Obj_t *)0x0) && ((*(uint *)&pOut->field_0x14 & 0xf) - 5 < 0xfffffffe)) {
    __assert_fail("pOut == NULL || Abc_ObjIsCo(pOut)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,999,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if (((pIn != (Abc_Obj_t *)0x0) && (uVar5 = *(uint *)&pIn->field_0x14 & 0xf, uVar5 != 2)) &&
     (uVar5 != 5)) {
    __assert_fail("pIn == NULL || Abc_ObjIsCi(pIn)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,1000,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if ((pOut == (Abc_Obj_t *)0x0 && pIn == (Abc_Obj_t *)0x0) && fPrint == 0) {
    vSlacks = (Vec_Int_t *)0x0;
  }
  else {
    vSlacks = Abc_NtkDelayTraceSlackStart(pNtk);
  }
  Abc_NtkTimePrepare(pNtk);
  pVVar8 = Abc_NtkDfs(pNtk,1);
  if (0 < pVVar8->nSize) {
    lVar16 = 0;
    do {
      Abc_NodeDelayTraceArrival((Abc_Obj_t *)pVVar8->pArray[lVar16],vSlacks);
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar8->nSize);
  }
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (void **)0x0;
  }
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    free(pVVar8);
  }
  pVVar8 = pNtk->vCos;
  lVar16 = (long)pVVar8->nSize;
  if (lVar16 < 1) {
    fVar21 = -1e+09;
  }
  else {
    fVar21 = -1e+09;
    lVar17 = 0;
    do {
      plVar3 = *(long **)(*(long *)(*(long *)(*pVVar8->pArray[lVar17] + 0x20) + 8) +
                         (long)**(int **)((long)pVVar8->pArray[lVar17] + 0x20) * 8);
      pfVar4 = *(float **)
                (*(long *)(*(long *)(*(long *)(*plVar3 + 0x108) + 0x10) + 8) +
                (long)(int)plVar3[2] * 8);
      fVar19 = pfVar4[1];
      fVar22 = *pfVar4;
      if (fVar19 <= fVar22) {
        fVar19 = fVar22;
      }
      if (fVar19 <= fVar21) {
        fVar19 = fVar21;
      }
      fVar21 = fVar19;
      lVar17 = lVar17 + 1;
    } while (lVar16 != lVar17);
  }
  if (pOut == (Abc_Obj_t *)0x0 && fPrint != 0) {
    if (pVVar8->nSize < 1) {
      pOut = (Abc_Obj_t *)0x0;
    }
    else {
      lVar17 = 0;
      pOut = (Abc_Obj_t *)0x0;
      do {
        pAVar18 = (Abc_Obj_t *)pVVar8->pArray[lVar17];
        plVar3 = (long *)pAVar18->pNtk->vObjs->pArray[*(pAVar18->vFanins).pArray];
        pfVar4 = *(float **)
                  (*(long *)(*(long *)(*(long *)(*plVar3 + 0x108) + 0x10) + 8) +
                  (long)(int)plVar3[2] * 8);
        fVar22 = pfVar4[1];
        fVar19 = *pfVar4;
        if (fVar22 <= fVar19) {
          fVar22 = fVar19;
        }
        if (fVar21 != fVar22) {
          pAVar18 = pOut;
        }
        if (!NAN(fVar21) && !NAN(fVar22)) {
          pOut = pAVar18;
        }
        lVar17 = lVar17 + 1;
      } while (lVar16 != lVar17);
    }
    if (pOut == (Abc_Obj_t *)0x0) {
      __assert_fail("pOut != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x409,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
    }
  }
  if (fPrint != 0) {
    vPath = (Vec_Ptr_t *)malloc(0x10);
    vPath->nCap = 100;
    vPath->nSize = 0;
    ppvVar9 = (void **)malloc(800);
    vPath->pArray = ppvVar9;
    pVVar8 = pNtk->vObjs;
    iVar6 = pVVar8->nSize;
    vBest = (Vec_Int_t *)malloc(0x10);
    iVar7 = 0x10;
    if (0xe < iVar6 - 1U) {
      iVar7 = iVar6;
    }
    vBest->nSize = 0;
    vBest->nCap = iVar7;
    if (iVar7 == 0) {
      piVar10 = (int *)0x0;
    }
    else {
      piVar10 = (int *)malloc((long)iVar7 << 2);
    }
    vBest->pArray = piVar10;
    vBest->nSize = iVar6;
    if (piVar10 != (int *)0x0) {
      memset(piVar10,0xff,(long)iVar6 << 2);
    }
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar6 = pVVar8->nSize;
      uVar1 = (long)iVar6 + 500;
      iVar7 = (int)uVar1;
      if ((pNtk->vTravIds).nCap < iVar7) {
        piVar10 = (int *)malloc(uVar1 * 4);
        (pNtk->vTravIds).pArray = piVar10;
        if (piVar10 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar7;
      }
      if (-500 < iVar6) {
        memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar7;
    }
    iVar6 = pNtk->nTravIds;
    pNtk->nTravIds = iVar6 + 1;
    if (0x3ffffffe < iVar6) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    iVar6 = Abc_NtkDelayTraceCritPath_rec
                      (vSlacks,(Abc_Obj_t *)pOut->pNtk->vObjs->pArray[*(pOut->vFanins).pArray],pIn,
                       vBest);
    if (iVar6 == 0) {
      if (pIn == (Abc_Obj_t *)0x0) {
        pcVar12 = Abc_ObjName(pOut);
        printf("The logic cone of PO \"%s\" has no primary inputs.\n",pcVar12);
      }
      else {
        pcVar12 = Abc_ObjName(pIn);
        pcVar14 = Abc_ObjName(pOut);
        printf("There is no combinational path between PI \"%s\" and PO \"%s\".\n",pcVar12,pcVar14);
      }
    }
    else {
      pAVar11 = Abc_NodeReadRequired(pOut);
      fVar22 = pAVar11->Rise;
      pAVar11 = Abc_NodeReadRequired(pOut);
      if (pAVar11->Fall <= fVar22) {
        fVar22 = pAVar11->Fall;
      }
      pAVar18 = (Abc_Obj_t *)pOut->pNtk->vObjs->pArray[*(pOut->vFanins).pArray];
      pfVar4 = (float *)pAVar18->pNtk->pManTime->vArrs->pArray[pAVar18->Id];
      fVar19 = *pfVar4;
      fVar20 = pfVar4[1];
      if (fVar19 <= fVar20) {
        fVar19 = fVar20;
      }
      Abc_NtkDelayTraceCritPathCollect_rec(vSlacks,pAVar18,vBest,vPath);
      if (pIn == (Abc_Obj_t *)0x0) {
        if (vPath->nSize < 1) {
LAB_0031b4be:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pIn = (Abc_Obj_t *)*vPath->pArray;
      }
      iVar6 = vPath->nSize;
      if ((long)iVar6 < 1) {
        local_78 = 0;
      }
      else {
        ppvVar9 = vPath->pArray;
        lVar16 = 0;
        local_78 = 0;
        do {
          iVar7 = local_78;
          if ((*(uint *)((long)ppvVar9[lVar16] + 0x14) & 0xf) == 7) {
            pcVar12 = Mio_GateReadName(*(Mio_Gate_t **)((long)ppvVar9[lVar16] + 0x38));
            sVar13 = strlen(pcVar12);
            iVar7 = (int)sVar13;
            if ((int)sVar13 < local_78) {
              iVar7 = local_78;
            }
          }
          local_78 = iVar7;
          lVar16 = lVar16 + 1;
        } while (iVar6 != lVar16);
      }
      Abc_NtkLevel(pNtk);
      pcVar12 = Abc_ObjName(pIn);
      pcVar14 = Abc_ObjName(pOut);
      printf("Critical path from PI \"%s\" to PO \"%s\":\n",pcVar12,pcVar14);
      iVar6 = vPath->nSize;
      if (0 < (long)iVar6) {
        ppvVar9 = vPath->pArray;
        lVar16 = 0;
        do {
          pAVar18 = (Abc_Obj_t *)ppvVar9[lVar16];
          printf("Level %3d : ",(ulong)(*(uint *)&pAVar18->field_0x14 >> 0xc));
          uVar5 = *(uint *)&pAVar18->field_0x14 & 0xf;
          if ((uVar5 == 5) || (uVar5 == 2)) {
            pcVar12 = Abc_ObjName(pAVar18);
            printf("Primary input \"%s\".   ",pcVar12);
            pppvVar15 = &pAVar18->pNtk->pManTime->vArrs->pArray;
            pcVar12 = "Arrival time =%6.1f. ";
          }
          else if (uVar5 - 5 < 0xfffffffe) {
            if (uVar5 != 7) {
              __assert_fail("Abc_ObjIsNode(pNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                            ,0x43c,
                            "float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
            }
            if (lVar16 == 0) goto LAB_0031b4be;
            iPin = Abc_NodeFindFanin(pAVar18,(Abc_Obj_t *)ppvVar9[lVar16 + -1]);
            iVar7 = pAVar18->Id;
            if ((((long)iVar7 < 0) || (vSlacks->nSize <= iVar7)) ||
               ((iVar7 = vSlacks->pArray[iVar7] + iPin, iVar7 < 0 || (vSlacks->nSize <= iVar7)))) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            pcVar12 = Abc_ObjName(pAVar18);
            printf("%10s/",pcVar12);
            pcVar12 = Mio_GateReadPinName((Mio_Gate_t *)(pAVar18->field_5).pData,iPin);
            printf("%-4s",pcVar12);
            pcVar12 = Mio_GateReadName((Mio_Gate_t *)(pAVar18->field_5).pData);
            printf(" (%s)",pcVar12);
            pcVar12 = Mio_GateReadName((Mio_Gate_t *)(pAVar18->field_5).pData);
            sVar13 = strlen(pcVar12);
            iVar7 = local_78 - (int)sVar13;
            if (iVar7 != 0 && (int)sVar13 <= local_78) {
              do {
                putchar(0x20);
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            printf("   ");
            pfVar4 = (float *)pAVar18->pNtk->pManTime->vArrs->pArray[pAVar18->Id];
            fVar20 = *pfVar4;
            fVar2 = pfVar4[1];
            if (fVar20 <= fVar2) {
              fVar20 = fVar2;
            }
            printf("Arrival =%6.1f.   ",(double)fVar20);
            printf("I/O times: (");
            if (0 < (pAVar18->vFanins).nSize) {
              lVar17 = 0;
              do {
                plVar3 = (long *)pAVar18->pNtk->vObjs->pArray[(pAVar18->vFanins).pArray[lVar17]];
                pcVar12 = "    \"%s\", ";
                if (lVar17 == 0) {
                  pcVar12 = "T = %d\t\t";
                }
                pfVar4 = *(float **)
                          (*(long *)(*(long *)(*(long *)(*plVar3 + 0x108) + 0x10) + 8) +
                          (long)(int)plVar3[2] * 8);
                fVar20 = *pfVar4;
                fVar2 = pfVar4[1];
                if (fVar20 <= fVar2) {
                  fVar20 = fVar2;
                }
                printf("%s%.1f",(double)fVar20,pcVar12 + 8);
                lVar17 = lVar17 + 1;
              } while (lVar17 < (pAVar18->vFanins).nSize);
            }
            pppvVar15 = &pAVar18->pNtk->pManTime->vArrs->pArray;
            pcVar12 = " -> %.1f)";
          }
          else {
            pcVar12 = Abc_ObjName(pAVar18);
            printf("Primary output \"%s\".   ",pcVar12);
            pppvVar15 = &pAVar18->pNtk->pManTime->vArrs->pArray;
            pcVar12 = "Arrival =%6.1f. ";
          }
          fVar20 = *(*pppvVar15)[pAVar18->Id];
          fVar2 = *(float *)((long)(*pppvVar15)[pAVar18->Id] + 4);
          if (fVar20 <= fVar2) {
            fVar20 = fVar2;
          }
          printf(pcVar12,(double)fVar20);
          putchar(10);
          lVar16 = lVar16 + 1;
        } while (lVar16 != iVar6);
      }
      printf("Level %3d : ",
             (ulong)((*(uint *)((long)pOut->pNtk->vObjs->pArray[*(pOut->vFanins).pArray] + 0x14) >>
                     0xc) + 1));
      pcVar12 = Abc_ObjName(pOut);
      printf("Primary output \"%s\".   ",pcVar12);
      pAVar11 = Abc_NodeReadRequired(pOut);
      fVar20 = pAVar11->Rise;
      pAVar11 = Abc_NodeReadRequired(pOut);
      if (pAVar11->Fall <= fVar20) {
        fVar20 = pAVar11->Fall;
      }
      printf("Required time = %6.1f.  ",(double)fVar20);
      printf("Path slack = %6.1f.\n",(double)(fVar22 - fVar19));
    }
    if (vPath->pArray != (void **)0x0) {
      free(vPath->pArray);
      vPath->pArray = (void **)0x0;
    }
    free(vPath);
    if (vBest->pArray != (int *)0x0) {
      free(vBest->pArray);
      vBest->pArray = (int *)0x0;
    }
    free(vBest);
  }
  if (vSlacks != (Vec_Int_t *)0x0) {
    if (vSlacks->pArray != (int *)0x0) {
      free(vSlacks->pArray);
      vSlacks->pArray = (int *)0x0;
    }
    free(vSlacks);
  }
  return fVar21;
}

Assistant:

float Abc_NtkDelayTrace( Abc_Ntk_t * pNtk, Abc_Obj_t * pOut, Abc_Obj_t * pIn, int fPrint )
{
    Vec_Int_t * vSlacks = NULL;
    Abc_Obj_t * pNode, * pDriver;
    Vec_Ptr_t * vNodes;
    Abc_Time_t * pTime;
    float tArrivalMax;
    int i;

    assert( Abc_NtkIsMappedLogic(pNtk) );
    assert( pOut == NULL || Abc_ObjIsCo(pOut) );
    assert( pIn == NULL || Abc_ObjIsCi(pIn) );

    // create slacks (need slacks if printing is requested even if pIn/pOut are not given)
    if ( pOut || pIn || fPrint )
        vSlacks = Abc_NtkDelayTraceSlackStart( pNtk );

    // compute the timing
    Abc_NtkTimePrepare( pNtk );
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        Abc_NodeDelayTraceArrival( pNode, vSlacks );
    Vec_PtrFree( vNodes );

    // get the latest arrival times
    tArrivalMax = -ABC_INFINITY;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0(pNode);
        pTime   = Abc_NodeArrival(pDriver);
        if ( tArrivalMax < Abc_MaxFloat(pTime->Fall, pTime->Rise) )
            tArrivalMax = Abc_MaxFloat(pTime->Fall, pTime->Rise);
    }

    // determine the output to print
    if ( fPrint && pOut == NULL )
    {
        Abc_NtkForEachCo( pNtk, pNode, i )
        {
            pDriver = Abc_ObjFanin0(pNode);
            pTime   = Abc_NodeArrival(pDriver);
            if ( tArrivalMax == Abc_MaxFloat(pTime->Fall, pTime->Rise) )
                pOut = pNode;
        }
        assert( pOut != NULL );
    }

    if ( fPrint )
    {
        Vec_Ptr_t * vPath = Vec_PtrAlloc( 100 );
        Vec_Int_t * vBest = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
        // traverse to determine the critical path
        Abc_NtkIncrementTravId( pNtk );
        if ( !Abc_NtkDelayTraceCritPath_rec( vSlacks, Abc_ObjFanin0(pOut), pIn, vBest ) )
        {
            if ( pIn == NULL )
                printf( "The logic cone of PO \"%s\" has no primary inputs.\n", Abc_ObjName(pOut) );
            else
                printf( "There is no combinational path between PI \"%s\" and PO \"%s\".\n", Abc_ObjName(pIn), Abc_ObjName(pOut) );
        }
        else
        {
            float Slack = 0.0, SlackAdd;
            int k, iFanin, Length = 0;
            Abc_Obj_t * pFanin;
            // check the additional slack
            SlackAdd = Abc_NodeReadRequiredWorst(pOut) - Abc_NodeReadArrivalWorst(Abc_ObjFanin0(pOut));
            // collect the critical path
            Abc_NtkDelayTraceCritPathCollect_rec( vSlacks, Abc_ObjFanin0(pOut), vBest, vPath );
            if ( pIn == NULL )
                pIn = (Abc_Obj_t *)Vec_PtrEntry( vPath, 0 );
            // find the longest gate name
            Vec_PtrForEachEntry( Abc_Obj_t *, vPath, pNode, i )
                if ( Abc_ObjIsNode(pNode) )
                    Length = Abc_MaxInt( Length, strlen(Mio_GateReadName((Mio_Gate_t *)pNode->pData)) );
            // print critical path
            Abc_NtkLevel( pNtk );
            printf( "Critical path from PI \"%s\" to PO \"%s\":\n", Abc_ObjName(pIn), Abc_ObjName(pOut) ); 
            Vec_PtrForEachEntry( Abc_Obj_t *, vPath, pNode, i )
            {
                printf( "Level %3d : ", Abc_ObjLevel(pNode) );
                if ( Abc_ObjIsCi(pNode) )
                {
                    printf( "Primary input \"%s\".   ", Abc_ObjName(pNode) );
                    printf( "Arrival time =%6.1f. ", Abc_NodeReadArrivalWorst(pNode) );
                    printf( "\n" );
                    continue;
                }
                if ( Abc_ObjIsCo(pNode) )
                {
                    printf( "Primary output \"%s\".   ", Abc_ObjName(pNode) );
                    printf( "Arrival =%6.1f. ", Abc_NodeReadArrivalWorst(pNode) );
                }
                else
                {
                    assert( Abc_ObjIsNode(pNode) );
                    iFanin = Abc_NodeFindFanin( pNode, (Abc_Obj_t *)Vec_PtrEntry(vPath,i-1) );
                    Slack = Abc_NtkDelayTraceSlack(vSlacks, pNode, iFanin);
                    printf( "%10s/", Abc_ObjName(pNode) );
                    printf( "%-4s", Mio_GateReadPinName((Mio_Gate_t *)pNode->pData, iFanin) );
                    printf( " (%s)", Mio_GateReadName((Mio_Gate_t *)pNode->pData) );
                    for ( k = strlen(Mio_GateReadName((Mio_Gate_t *)pNode->pData)); k < Length; k++ )
                        printf( " " );
                    printf( "   " );
                    printf( "Arrival =%6.1f.   ", Abc_NodeReadArrivalWorst(pNode) );
                    printf( "I/O times: (" );
                    Abc_ObjForEachFanin( pNode, pFanin, k )
                        printf( "%s%.1f", (k? ", ":""), Abc_NodeReadArrivalWorst(pFanin) );
//                    printf( " -> %.1f)", Abc_NodeReadArrival(pNode)->Worst + Slack + SlackAdd );
                    printf( " -> %.1f)", Abc_NodeReadArrivalWorst(pNode) );
                }
                printf( "\n" );
            }
            printf( "Level %3d : ", Abc_ObjLevel(Abc_ObjFanin0(pOut)) + 1 );
            printf( "Primary output \"%s\".   ", Abc_ObjName(pOut) );
            printf( "Required time = %6.1f.  ", Abc_NodeReadRequiredWorst(pOut) );
            printf( "Path slack = %6.1f.\n", SlackAdd );
        }
        Vec_PtrFree( vPath );
        Vec_IntFree( vBest );
    }

    Vec_IntFreeP( &vSlacks );
    return tArrivalMax;
}